

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

bool __thiscall
diligent_spirv_cross::Compiler::is_member_builtin
          (Compiler *this,SPIRType *type,uint32_t index,BuiltIn *builtin)

{
  Decoration *pDVar1;
  Meta *pMVar2;
  ulong uVar3;
  
  pMVar2 = ParsedIR::find_meta(&this->ir,(ID)(type->super_IVariant).self.id);
  if ((pMVar2 != (Meta *)0x0) &&
     (uVar3 = (ulong)index,
     uVar3 < (pMVar2->members).super_VectorView<diligent_spirv_cross::Meta::Decoration>.buffer_size)
     ) {
    pDVar1 = (pMVar2->members).super_VectorView<diligent_spirv_cross::Meta::Decoration>.ptr;
    if (pDVar1[uVar3].builtin == true) {
      if (builtin == (BuiltIn *)0x0) {
        return true;
      }
      *builtin = pDVar1[uVar3].builtin_type;
      return true;
    }
  }
  return false;
}

Assistant:

bool Compiler::is_member_builtin(const SPIRType &type, uint32_t index, BuiltIn *builtin) const
{
	auto *type_meta = ir.find_meta(type.self);

	if (type_meta)
	{
		auto &memb = type_meta->members;
		if (index < memb.size() && memb[index].builtin)
		{
			if (builtin)
				*builtin = memb[index].builtin_type;
			return true;
		}
	}

	return false;
}